

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ptree-rb.c
# Opt level: O1

void pp_tree_rb_balance_remove(PTreeRBNode *node,PTreeBaseNode **root)

{
  PTreeRBNode *pPVar1;
  PTreeBaseNode_ *pPVar2;
  PTreeBaseNode_ *pPVar3;
  PTreeRBNode *pPVar4;
  PTreeRBNode *node_00;
  PTreeRBNode_ **ppPVar5;
  
  pPVar4 = node->parent;
  if (pPVar4 != (PTreeRBNode *)0x0) {
    ppPVar5 = &node->parent;
    do {
      pPVar1 = (PTreeRBNode *)(pPVar4->base).left;
      node_00 = pPVar1;
      if (pPVar1 == node) {
        node_00 = (PTreeRBNode *)(pPVar4->base).right;
      }
      if ((node_00->color & P_TREE_RB_COLOR_RED) != 0) {
        pPVar4->color = P_TREE_RB_COLOR_RED;
        node_00->color = P_TREE_RB_COLOR_BLACK;
        if (pPVar1 == node) {
          pp_tree_rb_rotate_left(pPVar4,root);
        }
        else {
          pp_tree_rb_rotate_right(pPVar4,root);
        }
        node_00 = (PTreeRBNode *)((*ppPVar5)->base).left;
        if (node_00 == node) {
          node_00 = (PTreeRBNode *)((*ppPVar5)->base).right;
        }
      }
      pPVar2 = (node_00->base).left;
      if (((pPVar2 != (PTreeBaseNode_ *)0x0) && (((ulong)pPVar2[1].right & 2) == 0)) ||
         ((pPVar3 = (node_00->base).right, pPVar3 != (PTreeBaseNode_ *)0x0 &&
          (((ulong)pPVar3[1].right & 2) == 0)))) {
        if ((node == (PTreeRBNode *)((*ppPVar5)->base).left) &&
           ((pPVar3 = (node_00->base).right, pPVar3 == (PTreeBaseNode_ *)0x0 ||
            (((ulong)pPVar3[1].right & 2) != 0)))) {
          node_00->color = P_TREE_RB_COLOR_RED;
          *(undefined4 *)&pPVar2[1].right = 2;
          pp_tree_rb_rotate_right(node_00,root);
        }
        else {
          if ((node != (PTreeRBNode *)((*ppPVar5)->base).right) ||
             ((pPVar2 != (PTreeBaseNode_ *)0x0 && (((ulong)pPVar2[1].right & 2) == 0))))
          goto LAB_0010ae99;
          node_00->color = P_TREE_RB_COLOR_RED;
          *(undefined4 *)&(node_00->base).right[1].right = 2;
          pp_tree_rb_rotate_left(node_00,root);
        }
        node_00 = (PTreeRBNode *)((*ppPVar5)->base).left;
        if (node_00 == node) {
          node_00 = (PTreeRBNode *)((*ppPVar5)->base).right;
        }
LAB_0010ae99:
        pPVar4 = *ppPVar5;
        node_00->color = pPVar4->color;
        pPVar4->color = P_TREE_RB_COLOR_BLACK;
        if (node == (PTreeRBNode *)(pPVar4->base).left) {
          *(undefined4 *)&(node_00->base).right[1].right = 2;
          pp_tree_rb_rotate_left(pPVar4,root);
          return;
        }
        *(undefined4 *)&(node_00->base).left[1].right = 2;
        pp_tree_rb_rotate_right(pPVar4,root);
        return;
      }
      node_00->color = P_TREE_RB_COLOR_RED;
      node = *ppPVar5;
      if ((node != (PTreeRBNode *)0x0) && ((node->color & P_TREE_RB_COLOR_BLACK) == 0)) {
        node->color = P_TREE_RB_COLOR_BLACK;
        return;
      }
      ppPVar5 = &node->parent;
      pPVar4 = node->parent;
    } while (pPVar4 != (PTreeRBNode *)0x0);
  }
  return;
}

Assistant:

static void
pp_tree_rb_balance_remove (PTreeRBNode *node, PTreeBaseNode **root)
{
	PTreeRBNode *sibling;

	while (TRUE) {
		/* Case 1: We are at the root */
		if (P_UNLIKELY (node->parent == NULL))
			break;

		sibling = pp_tree_rb_get_sibling (node);

		if (pp_tree_rb_is_red (sibling) == TRUE) {
			/*
			 * Case 2: Left (right) rotate at parent
			 *
			 *     P               S
			 *    / \             / \
			 *   N   s    -->    p   Sr
			 *      / \         / \
			 *     Sl  Sr      N   Sl
			 */
			node->parent->color = P_TREE_RB_COLOR_RED;
			sibling->color      = P_TREE_RB_COLOR_BLACK;

			if ((PTreeBaseNode *) node == node->parent->base.left)
				pp_tree_rb_rotate_left (node->parent, root);
			else
				pp_tree_rb_rotate_right (node->parent, root);

			sibling = pp_tree_rb_get_sibling (node);
		}

		/*
		 * Case 3: Sibling (parent) color flip
		 *
		 *    (p)           (p)
		 *    / \           / \
		 *   N   S    -->  N   s
		 *      / \           / \
		 *     Sl  Sr        Sl  Sr
		 */
		if (pp_tree_rb_is_black ((PTreeRBNode *) sibling->base.left)  == TRUE &&
		    pp_tree_rb_is_black ((PTreeRBNode *) sibling->base.right) == TRUE) {
			sibling->color = P_TREE_RB_COLOR_RED;

			if (pp_tree_rb_is_black (node->parent) == TRUE) {
				node = node->parent;
				continue;
			} else {
				node->parent->color = P_TREE_RB_COLOR_BLACK;
				break;
			}
		}

		/*
		 * Case 4: Right (left) rotate at sibling
		 *
		 *   (p)           (p)
		 *   / \           / \
		 *  N   S    -->  N   Sl
		 *     / \             \
		 *    sl  Sr            s
		 *                       \
		 *                        Sr
		 */
		if ((PTreeBaseNode *) node == node->parent->base.left &&
		    pp_tree_rb_is_black ((PTreeRBNode *) sibling->base.right) == TRUE) {
			sibling->color = P_TREE_RB_COLOR_RED;
			((PTreeRBNode *) sibling->base.left)->color = P_TREE_RB_COLOR_BLACK;

			pp_tree_rb_rotate_right (sibling, root);

			sibling = pp_tree_rb_get_sibling (node);
		} else if ((PTreeBaseNode *) node == node->parent->base.right &&
			   pp_tree_rb_is_black ((PTreeRBNode *) sibling->base.left) == TRUE) {
			sibling->color = P_TREE_RB_COLOR_RED;
			((PTreeRBNode *) sibling->base.right)->color = P_TREE_RB_COLOR_BLACK;

			pp_tree_rb_rotate_left (sibling, root);

			sibling = pp_tree_rb_get_sibling (node);
		}

		/*
		 * Case 5: Left (right) rotate at parent and color flips
		 *
		 *      (p)             (s)
		 *      / \             / \
		 *     N   S     -->   P   Sr
		 *        / \         / \
		 *      (sl) sr      N  (sl)
		 */
		sibling->color      = node->parent->color;
		node->parent->color = P_TREE_RB_COLOR_BLACK;

		if ((PTreeBaseNode *) node == node->parent->base.left) {
			((PTreeRBNode *) sibling->base.right)->color = P_TREE_RB_COLOR_BLACK;
			pp_tree_rb_rotate_left (node->parent, root);
		} else {
			((PTreeRBNode *) sibling->base.left)->color = P_TREE_RB_COLOR_BLACK;
			pp_tree_rb_rotate_right (node->parent, root);
		}

		break;
	}
}